

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_arithmetic.cpp
# Opt level: O3

bool dxil_spv::emit_bit_count_instruction(Impl *impl,CallInst *instruction)

{
  uint uVar1;
  Id IVar2;
  Id type_id;
  Id arg;
  Builder *this;
  Value *pVVar3;
  Type *this_00;
  Operation *pOVar4;
  Operation *pOVar5;
  Operation *this_01;
  Operation *this_02;
  
  this = Converter::Impl::builder(impl);
  pVVar3 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  this_00 = LLVMBC::Value::getType(pVVar3);
  uVar1 = LLVMBC::Type::getIntegerBitWidth(this_00);
  if (uVar1 == 0x10) {
    IVar2 = spv::Builder::makeIntegerType(this,0x20,false);
    pOVar5 = Converter::Impl::allocate(impl,OpUConvert,IVar2);
    pVVar3 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    IVar2 = Converter::Impl::get_id_for_value(impl,pVVar3,0);
    Operation::add_id(pOVar5,IVar2);
    Converter::Impl::add(impl,pOVar5,false);
    pOVar4 = Converter::Impl::allocate(impl,OpBitCount,(Value *)instruction);
    IVar2 = pOVar5->id;
  }
  else if (uVar1 == 0x40) {
    IVar2 = spv::Builder::makeIntegerType(this,0x20,false);
    type_id = spv::Builder::makeVectorType(this,IVar2,2);
    pOVar4 = Converter::Impl::allocate(impl,OpBitcast,type_id);
    pVVar3 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    arg = Converter::Impl::get_id_for_value(impl,pVVar3,0);
    Operation::add_id(pOVar4,arg);
    Converter::Impl::add(impl,pOVar4,false);
    pOVar5 = Converter::Impl::allocate(impl,OpBitCount,type_id);
    Operation::add_id(pOVar5,pOVar4->id);
    Converter::Impl::add(impl,pOVar5,false);
    this_01 = Converter::Impl::allocate(impl,OpCompositeExtract,IVar2);
    Operation::add_id(this_01,pOVar5->id);
    Operation::add_literal(this_01,0);
    Converter::Impl::add(impl,this_01,false);
    this_02 = Converter::Impl::allocate(impl,OpCompositeExtract,IVar2);
    Operation::add_id(this_02,pOVar5->id);
    Operation::add_literal(this_02,1);
    Converter::Impl::add(impl,this_02,false);
    pOVar4 = Converter::Impl::allocate(impl,OpIAdd,(Value *)instruction);
    Operation::add_id(pOVar4,this_01->id);
    IVar2 = this_02->id;
  }
  else {
    if (uVar1 != 0x20) {
      return false;
    }
    pOVar4 = Converter::Impl::allocate(impl,OpBitCount,(Value *)instruction);
    pVVar3 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    IVar2 = Converter::Impl::get_id_for_value(impl,pVVar3,0);
  }
  Operation::add_id(pOVar4,IVar2);
  Converter::Impl::add(impl,pOVar4,false);
  return true;
}

Assistant:

bool emit_bit_count_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	// Vulkan only allows 32-bit types here for whatever reason ...
	auto &builder = impl.builder();
	auto int_width = instruction->getOperand(1)->getType()->getIntegerBitWidth();

	if (int_width == 32)
	{
		auto *op = impl.allocate(spv::OpBitCount, instruction);
		op->add_id(impl.get_id_for_value(instruction->getOperand(1)));
		impl.add(op);
		return true;
	}
	else if (int_width == 16)
	{
		auto *conv_op = impl.allocate(spv::OpUConvert, builder.makeUintType(32));
		conv_op->add_id(impl.get_id_for_value(instruction->getOperand(1)));
		impl.add(conv_op);

		auto *op = impl.allocate(spv::OpBitCount, instruction);
		op->add_id(conv_op->id);
		impl.add(op);
		return true;
	}
	else if (int_width == 64)
	{
		spv::Id uint_type = builder.makeUintType(32);
		spv::Id uvec2_type = builder.makeVectorType(uint_type, 2);

		auto *conv_op = impl.allocate(spv::OpBitcast, uvec2_type);
		conv_op->add_id(impl.get_id_for_value(instruction->getOperand(1)));
		impl.add(conv_op);

		auto *count_op = impl.allocate(spv::OpBitCount, uvec2_type);
		count_op->add_id(conv_op->id);
		impl.add(count_op);

		auto *ext0 = impl.allocate(spv::OpCompositeExtract, uint_type);
		ext0->add_id(count_op->id);
		ext0->add_literal(0);
		impl.add(ext0);

		auto *ext1 = impl.allocate(spv::OpCompositeExtract, uint_type);
		ext1->add_id(count_op->id);
		ext1->add_literal(1);
		impl.add(ext1);

		auto *add_op = impl.allocate(spv::OpIAdd, instruction);
		add_op->add_id(ext0->id);
		add_op->add_id(ext1->id);
		impl.add(add_op);
		return true;
	}

	return false;
}